

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_1000_1999.cpp
# Opt level: O0

void __thiscall psy::C::DeclarationBinderTester::case1303(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t __len;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548;
  Decl local_528;
  Decl local_460;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  Decl local_348;
  Decl local_280;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30 [32];
  DeclarationBinderTester *local_10;
  DeclarationBinderTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"x y [ 1 ] , z [ 2 ] ;",&local_31);
  Expectation::Expectation(&local_1b8);
  Decl::Decl(&local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"y",&local_369);
  pDVar1 = Decl::Object(&local_348,&local_368,VariableDeclaration,File);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"x",&local_391);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_390,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Array,None,None);
  Decl::Decl(&local_280,pDVar1);
  pEVar2 = Expectation::declaration(&local_1b8,&local_280);
  Decl::Decl(&local_528);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"z",&local_549);
  pDVar1 = Decl::Object(&local_528,&local_548,VariableDeclaration,File);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"x",&local_571);
  pDVar1 = Ty::Typedef(&pDVar1->ty_,&local_570,None);
  __len = 0;
  pDVar1 = Ty::Derived(&pDVar1->ty_,Array,None,None);
  Decl::Decl(&local_460,pDVar1);
  pEVar2 = Expectation::declaration(pEVar2,&local_460);
  Expectation::Expectation(&local_100,pEVar2);
  bind(this,(int)local_30,(sockaddr *)&local_100,__len);
  Expectation::~Expectation(&local_100);
  Decl::~Decl(&local_460);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  Decl::~Decl(&local_528);
  Decl::~Decl(&local_280);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  Decl::~Decl(&local_348);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void DeclarationBinderTester::case1303()
{
    bind("x y [ 1 ] , z [ 2 ] ;",
         Expectation()
             .declaration(Decl().Object("y", SymbolKind::VariableDeclaration)
                      .ty_.Typedef("x", CVR::None)
                      .ty_.Derived(TypeKind::Array, CVR::None))
             .declaration(Decl().Object("z", SymbolKind::VariableDeclaration)
                      .ty_.Typedef("x", CVR::None)
                      .ty_.Derived(TypeKind::Array, CVR::None)));
}